

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
               (rt_binary_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  double __x;
  double dVar2;
  double __x_00;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa;
  double __x_03;
  double __x_04;
  double __x_05;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_158;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_128;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_108;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_e8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_c8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_a8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_88;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_68;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_48;
  
  local_140 = (undefined8 *)operator_new(0x18);
  local_138 = local_140 + 3;
  *local_140 = 0x4010000000000000;
  local_140[1] = 0x4018000000000000;
  local_140[2] = 0x4020000000000000;
  local_130 = local_138;
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012fd20;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_48,e);
  (*local_48.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_48,&local_140);
  dVar2 = exp(__x);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_48.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_48.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_48.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_48.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_48.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_48.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_48.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f860;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_68,e);
  (*local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_68,&local_140);
  dVar2 = sin(__x_00);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f8f0;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_88,e);
  (*local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_88,&local_140);
  dVar2 = cos(__x_01);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_88.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_88.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_88.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_88.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f980;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_a8,e);
  (*local_a8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_a8,&local_140);
  dVar2 = tan(__x_02);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_a8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_a8.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a8.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_a8.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_a8.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_a8.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a8.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012fa10;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_c8,e);
  (*local_c8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_c8,&local_140);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,ABS(extraout_XMM0_Qa));
  local_c8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_c8.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c8.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_c8.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_c8.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_c8.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c8.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012fae0;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_e8,e);
  (*local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_e8,&local_140);
  if (__x_03 < 0.0) {
    dVar2 = sqrt(__x_03);
  }
  else {
    dVar2 = SQRT(__x_03);
  }
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_e8.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e8.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_e8.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_e8.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_e8.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e8.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012fb70;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_05,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_108,e);
  (*local_108.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_108,&local_140);
  dVar2 = log(__x_04);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_108.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_108.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_108.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_108.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_108.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_108.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_108.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar1 = (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(e);
  local_158.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  (local_158.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012fc90;
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  local_158.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_128,e);
  (*local_128.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_128,&local_140);
  dVar2 = log10(__x_05);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_158,dVar2);
  local_128.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_128.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_128.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_128.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_128.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_128.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_128.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_158.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  if (local_158.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_158.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_158.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_158.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_140 != (undefined8 *)0x0) {
    operator_delete(local_140,(long)local_130 - (long)local_140);
  }
  return;
}

Assistant:

void unary_test(E const & e)
{
  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  unary_test(viennamath::exp(e),   exp(viennamath::eval(e,p)) );
  unary_test(viennamath::sin(e),   sin(viennamath::eval(e,p)) );
  unary_test(viennamath::cos(e),   cos(viennamath::eval(e,p)) );
  unary_test(viennamath::tan(e),   tan(viennamath::eval(e,p)) );
  unary_test(viennamath::fabs(e),  fabs(viennamath::eval(e,p)) );
  unary_test(viennamath::sqrt(e),  sqrt(viennamath::eval(e,p)) );
  unary_test(viennamath::log(e),   log(viennamath::eval(e,p)) );
  unary_test(viennamath::log10(e), log10(viennamath::eval(e,p)) );
}